

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O0

TypedName * __thiscall VkSpecParser::parseParamOrProto(VkSpecParser *this,QString *tag)

{
  QStringView v;
  QStringView v_00;
  byte bVar1;
  bool bVar2;
  VkSpecParser *in_RSI;
  TypedName *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  TypedName *t;
  char16_t *str_1;
  char16_t *str;
  QStringView text;
  DataPointer *in_stack_fffffffffffffe58;
  undefined5 in_stack_fffffffffffffe60;
  byte in_stack_fffffffffffffe65;
  byte in_stack_fffffffffffffe66;
  undefined1 in_stack_fffffffffffffe67;
  undefined1 uVar4;
  undefined6 uVar5;
  QChar c;
  VkSpecParser *this_00;
  QChar local_11a;
  qsizetype local_118;
  storage_type_conflict *local_110;
  QChar local_102;
  undefined1 local_100 [16];
  QStringView local_f0;
  QArrayDataPointer<char16_t> local_e0 [2];
  undefined1 local_a0 [16];
  QArrayDataPointer<char16_t> local_78 [2];
  undefined1 local_38 [16];
  undefined1 local_18 [16];
  long local_8;
  
  uVar5 = SUB86(in_RDI,0);
  c.ucs = (char16_t)((ulong)in_RDI >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RSI;
  memset(in_RDI,0xaa,0x48);
  TypedName::TypedName
            ((TypedName *)
             CONCAT17(in_stack_fffffffffffffe67,
                      CONCAT16(in_stack_fffffffffffffe66,
                               CONCAT15(in_stack_fffffffffffffe65,in_stack_fffffffffffffe60))));
  while( true ) {
    bVar1 = QXmlStreamReader::atEnd();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    QXmlStreamReader::readNext();
    bVar2 = QXmlStreamReader::isEndElement((QXmlStreamReader *)0x104d85);
    uVar4 = false;
    if (bVar2) {
      auVar3 = QXmlStreamReader::name();
      local_18 = auVar3;
      QStringView::QStringView<QString,_true>((QStringView *)in_RSI,&in_RDI->name);
      uVar4 = operator==((QStringView *)
                         CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe66,
                                                 CONCAT15(in_stack_fffffffffffffe65,
                                                          in_stack_fffffffffffffe60))),
                         (QStringView *)in_stack_fffffffffffffe58);
    }
    if ((bool)uVar4 != false) break;
    bVar2 = QXmlStreamReader::isStartElement((QXmlStreamReader *)0x104dfa);
    if (bVar2) {
      auVar3 = QXmlStreamReader::name();
      local_38 = auVar3;
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_78,(Data *)0x0,L"name",4);
      QString::QString((QString *)
                       CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe66,
                                               CONCAT15(in_stack_fffffffffffffe65,
                                                        in_stack_fffffffffffffe60))),
                       in_stack_fffffffffffffe58);
      QStringView::QStringView<QString,_true>((QStringView *)in_RSI,&in_RDI->name);
      in_stack_fffffffffffffe66 =
           operator==((QStringView *)
                      CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe66,
                                              CONCAT15(in_stack_fffffffffffffe65,
                                                       in_stack_fffffffffffffe60))),
                      (QStringView *)in_stack_fffffffffffffe58);
      QString::~QString((QString *)0x104eaf);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)
                 CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe66,
                                         CONCAT15(in_stack_fffffffffffffe65,
                                                  in_stack_fffffffffffffe60))));
      if ((in_stack_fffffffffffffe66 & 1) == 0) {
        auVar3 = QXmlStreamReader::name();
        local_a0 = auVar3;
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_e0,(Data *)0x0,L"type",4);
        QString::QString((QString *)
                         CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe66,
                                                 CONCAT15(in_stack_fffffffffffffe65,
                                                          in_stack_fffffffffffffe60))),
                         in_stack_fffffffffffffe58);
        QStringView::QStringView<QString,_true>((QStringView *)in_RSI,&in_RDI->name);
        in_stack_fffffffffffffe65 =
             operator!=((QStringView *)
                        CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe66,
                                                CONCAT15(in_stack_fffffffffffffe65,
                                                         in_stack_fffffffffffffe60))),
                        (QStringView *)in_stack_fffffffffffffe58);
        QString::~QString((QString *)0x104fa8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)
                   CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe66,
                                           CONCAT15(in_stack_fffffffffffffe65,
                                                    in_stack_fffffffffffffe60))));
        if ((in_stack_fffffffffffffe65 & 1) != 0) {
          skip((VkSpecParser *)
               CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe66,
                                       CONCAT15(in_stack_fffffffffffffe65,in_stack_fffffffffffffe60)
                                      )));
        }
      }
      else {
        parseName(this_00);
        QString::operator=((QString *)
                           CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe66,
                                                   CONCAT15(in_stack_fffffffffffffe65,
                                                            in_stack_fffffffffffffe60))),
                           (QString *)in_stack_fffffffffffffe58);
        QString::~QString((QString *)0x104ef7);
      }
    }
    else {
      local_f0.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_f0.m_size = 0xaaaaaaaaaaaaaaaa;
      auVar3 = QXmlStreamReader::text();
      local_100 = auVar3;
      local_f0 = QStringView::trimmed((QStringView *)in_RDI);
      bVar2 = QStringView::isEmpty((QStringView *)0x105036);
      if (!bVar2) {
        QChar::QChar<char16_t,_true>(&local_102,L'[');
        bVar2 = QStringView::startsWith((QStringView *)in_RSI,c);
        if (bVar2) {
          local_118 = local_f0.m_size;
          local_110 = local_f0.m_data;
          v.m_data._0_6_ = uVar5;
          v.m_size = (qsizetype)in_RSI;
          v.m_data._6_2_ = c.ucs;
          QString::operator+=((QString *)in_stack_fffffffffffffe58,v);
        }
        else {
          bVar2 = QString::isEmpty((QString *)0x1050b9);
          if (!bVar2) {
            QChar::QChar<char16_t,_true>(&local_11a,L' ');
            QString::operator+=((QString *)
                                CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe66,
                                                        CONCAT15(in_stack_fffffffffffffe65,
                                                                 in_stack_fffffffffffffe60))),
                                (QChar)(char16_t)((ulong)in_RDI >> 0x30));
          }
          v_00.m_data._0_6_ = uVar5;
          v_00.m_size = (qsizetype)in_RSI;
          v_00.m_data._6_2_ = c.ucs;
          QString::operator+=((QString *)in_stack_fffffffffffffe58,v_00);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

VkSpecParser::TypedName VkSpecParser::parseParamOrProto(const QString &tag)
{
    TypedName t;

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == tag)
            break;
        if (m_reader.isStartElement()) {
            if (m_reader.name() == QStringLiteral("name")) {
                t.name = parseName();
            } else if (m_reader.name() != QStringLiteral("type")) {
                skip();
            }
        } else {
            auto text = m_reader.text().trimmed();
            if (!text.isEmpty()) {
                if (text.startsWith(u'[')) {
                    t.typeSuffix += text;
                } else {
                    if (!t.type.isEmpty())
                        t.type += u' ';
                    t.type += text;
                }
            }
        }
    }

    return t;
}